

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWaveBank_Prepare
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags,
                   uint32_t dwPlayOffset,uint8_t nLoopCount,FACTWave **ppWave)

{
  FACTWaveBankEntry *pFVar1;
  FACTSeekTable *pFVar2;
  ushort uVar3;
  uint uVar4;
  FACTWave *pFVar5;
  uint8_t *puVar6;
  byte bVar7;
  uint32_t uVar8;
  code *pcVar9;
  FAudioBufferWMA *pBufferWMA;
  uint uVar10;
  FAudioSourceVoice *voice;
  undefined7 in_register_00000081;
  uint uVar11;
  double dVar12;
  anon_union_52_3_52b89101 format;
  FAudioVoiceSends sends;
  FAudioBufferWMA bufferWMA;
  FAudioSendDescriptor send;
  FAudioWaveFormatEx local_c0;
  ushort local_ae;
  uint local_ac;
  uint32_t local_a8;
  int local_a4;
  undefined4 local_a0;
  uint32_t local_9c;
  undefined4 local_98;
  uint32_t local_94;
  undefined2 local_90;
  undefined2 local_8e;
  uint local_8c;
  ulong local_88;
  FAudioBuffer local_80;
  FAudioVoiceSends local_54;
  FAudioBufferWMA local_48;
  FAudioSendDescriptor local_3c;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *ppWave = (FACTWave *)0x0;
    uVar8 = 1;
  }
  else {
    uVar10 = (uint)CONCAT71(in_register_00000081,nLoopCount);
    pFVar5 = (FACTWave *)(*pWaveBank->parentEngine->pMalloc)(0x90);
    *ppWave = pFVar5;
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    uVar11 = (uint)nWaveIndex;
    pFVar1 = pWaveBank->entries + nWaveIndex;
    (*ppWave)->parentBank = pWaveBank;
    (*ppWave)->parentCue = (FACTCue *)0x0;
    pFVar5 = *ppWave;
    pFVar5->index = nWaveIndex;
    pFVar5->notifyOnDestroy = '\0';
    pFVar5->usercontext = (void *)0x0;
    pFVar5 = *ppWave;
    pFVar5->state = 4;
    pFVar5->volume = 1.0;
    pFVar5->pitch = 0;
    pFVar5->loopCount = nLoopCount;
    local_54.pSends = &local_3c;
    local_3c.Flags = 0;
    local_3c.pOutputVoice = pWaveBank->parentEngine->master;
    local_54.SendCount = 1;
    uVar4 = *(ushort *)&pFVar1->Format >> 2 & 7;
    local_c0.nChannels = (uint16_t)uVar4;
    local_c0.nSamplesPerSec = (pFVar1->Format).dwValue >> 5 & 0x3ffff;
    switch((pFVar1->Format).dwValue & 3) {
    case 0:
      local_c0.wFormatTag = 1;
      bVar7 = -(char)((int)(pFVar1->Format).dwValue >> 0x1f);
      uVar4 = (uVar4 << (bVar7 + 3 & 0x1f)) >> 3;
      local_c0.nBlockAlign = (uint16_t)uVar4;
      local_c0.nAvgBytesPerSec = uVar4 * local_c0.nSamplesPerSec;
      local_c0._14_4_ = 8 << (bVar7 & 0x1f) & 0xffff;
      break;
    case 1:
      pFVar2 = pWaveBank->seekTables;
      local_c0.wFormatTag = 0x166;
      local_c0.nAvgBytesPerSec =
           *(uint32_t *)
            ((long)aWMAAvgBytesPerSec + (ulong)((pFVar1->Format).dwValue >> 0x1a & 0x1c));
      local_c0.nBlockAlign =
           *(ushort *)((long)aWMABlockAlign + (ulong)((pFVar1->Format).dwValue >> 0x15 & 0x7c));
      local_c0.wBitsPerSample = 0x10;
      local_c0.cbSize = 0x22;
      local_ae = (ushort)(uVar4 + 1 >> 1);
      local_ac = 0xffffffff >> (-(char)uVar4 & 0x1fU);
      if (local_c0.nChannels < 2) {
        local_ac = 0;
      }
      local_a8 = pFVar2[nWaveIndex].entries[pFVar2[nWaveIndex].entryCount - 1];
      local_8c = uVar10;
      local_88 = (ulong)nWaveIndex;
      dVar12 = (double)SDL_ceil(((double)(pFVar1->PlayRegion).dwLength /
                                (double)pFVar2[nWaveIndex].entryCount) * 0.00048828125);
      local_a4 = ((int)dVar12 & 0xffffU) << 0xb;
      local_98 = 0;
      local_a0 = 0;
      local_94 = local_a8;
      local_9c = local_a8;
      local_90 = 0x400;
      local_8e = (undefined2)pFVar2[nWaveIndex].entryCount;
      uVar11 = (uint)local_88;
      uVar10 = local_8c;
      break;
    case 2:
      local_c0.wFormatTag = 2;
      uVar3 = (ushort)((pFVar1->Format).dwValue >> 0x17) & 0xff;
      local_c0.nBlockAlign = local_c0.nChannels * (uVar3 + 0x16);
      local_c0.wBitsPerSample = 0x10;
      local_c0.cbSize = 4;
      local_ae = uVar3 * 2 + 0x20;
      break;
    case 3:
      local_c0.wFormatTag = 0x161;
      local_c0.nAvgBytesPerSec =
           *(uint32_t *)
            ((long)aWMAAvgBytesPerSec + (ulong)((pFVar1->Format).dwValue >> 0x1a & 0x1c));
      local_c0.nBlockAlign =
           *(ushort *)((long)aWMABlockAlign + (ulong)((pFVar1->Format).dwValue >> 0x15 & 0x7c));
      local_c0.wBitsPerSample = 0x10;
      local_c0.cbSize = 0;
    }
    pcVar9 = (OnBufferEndFunc)0x0;
    if (pWaveBank->streaming != 0) {
      pcVar9 = FACT_INTERNAL_OnBufferEnd;
    }
    ((*ppWave)->callback).callback.OnBufferEnd = pcVar9;
    ((*ppWave)->callback).callback.OnBufferStart = (OnBufferStartFunc)0x0;
    ((*ppWave)->callback).callback.OnLoopEnd = (OnLoopEndFunc)0x0;
    ((*ppWave)->callback).callback.OnStreamEnd = FACT_INTERNAL_OnStreamEnd;
    ((*ppWave)->callback).callback.OnVoiceError = (OnVoiceErrorFunc)0x0;
    ((*ppWave)->callback).callback.OnVoiceProcessingPassEnd = (OnVoiceProcessingPassEndFunc)0x0;
    ((*ppWave)->callback).callback.OnVoiceProcessingPassStart = (OnVoiceProcessingPassStartFunc)0x0;
    ((*ppWave)->callback).wave = *ppWave;
    pFVar5 = *ppWave;
    pFVar5->srcChannels = local_c0.nChannels;
    FAudio_CreateSourceVoice
              (pWaveBank->parentEngine->audio,&pFVar5->voice,&local_c0,8,4.0,
               &(pFVar5->callback).callback,&local_54,(FAudioEffectChain *)0x0);
    if (pWaveBank->streaming == 0) {
      (*ppWave)->streamCache = (uint8_t *)0x0;
      local_80.Flags = 0x40;
      local_80.AudioBytes = (pFVar1->PlayRegion).dwLength;
      local_80.pAudioData =
           FAudio_memptr((FAudioIOStream *)pWaveBank->io,(ulong)(pFVar1->PlayRegion).dwOffset);
      local_80.PlayBegin = 0;
      local_80.PlayLength = (pFVar1->field_0).dwFlagsAndDuration >> 4;
      if ((char)uVar10 == '\0') {
        local_80.LoopBegin = 0;
        local_80.LoopLength = 0;
        local_80.LoopCount = 0;
      }
      else {
        local_80.LoopCount = uVar10 & 0xff;
        local_80.LoopBegin = (pFVar1->LoopRegion).dwStartSample;
        local_80.LoopLength = (pFVar1->LoopRegion).dwTotalSamples;
      }
      local_80.pContext = (void *)0x0;
      if (local_c0.wFormatTag == 0x161) {
        local_48.pDecodedPacketCumulativeBytes =
             *(uint32_t **)((long)&pWaveBank->seekTables->entries + (ulong)(uVar11 << 4));
        pBufferWMA = &local_48;
        local_48.PacketCount =
             *(uint32_t *)((long)&pWaveBank->seekTables->entryCount + (ulong)(uVar11 << 4));
        voice = (*ppWave)->voice;
      }
      else {
        voice = (*ppWave)->voice;
        pBufferWMA = (FAudioBufferWMA *)0x0;
      }
      FAudioSourceVoice_SubmitSourceBuffer(voice,&local_80,pBufferWMA);
    }
    else {
      if (local_c0.wFormatTag == 2) {
        uVar8 = (uint)local_c0.nBlockAlign * (local_c0.nSamplesPerSec / local_ae);
      }
      else if (local_c0.wFormatTag == 1) {
        uVar8 = local_c0.nBlockAlign * local_c0.nSamplesPerSec;
      }
      else {
        uVar8 = (pFVar1->PlayRegion).dwLength;
      }
      (*ppWave)->streamSize = uVar8;
      puVar6 = (uint8_t *)(*pWaveBank->parentEngine->pMalloc)((size_t)uVar8);
      (*ppWave)->streamCache = puVar6;
      pFVar5 = *ppWave;
      pFVar5->streamOffset = (pFVar1->PlayRegion).dwOffset;
      FACT_INTERNAL_OnBufferEnd(&(pFVar5->callback).callback,(void *)0x0);
    }
    LinkedList_AddEntry(&pWaveBank->waveList,*ppWave,pWaveBank->waveLock,
                        pWaveBank->parentEngine->pMalloc);
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

uint32_t FACTWaveBank_Prepare(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags,
	uint32_t dwPlayOffset,
	uint8_t nLoopCount,
	FACTWave **ppWave
) {
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FAudioVoiceSends sends;
	FAudioSendDescriptor send;
	union
	{
		FAudioWaveFormatEx pcm;
		FAudioADPCMWaveFormat adpcm;
		FAudioXMA2WaveFormat xma2;
	} format;
	FACTWaveBankEntry *entry;
	FACTSeekTable *seek;
	if (pWaveBank == NULL)
	{
		*ppWave = NULL;
		return 1;
	}

	*ppWave = (FACTWave*) pWaveBank->parentEngine->pMalloc(sizeof(FACTWave));

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	/* Engine references */
	(*ppWave)->parentBank = pWaveBank;
	(*ppWave)->parentCue = NULL;
	(*ppWave)->index = nWaveIndex;
	(*ppWave)->notifyOnDestroy = 0;
	(*ppWave)->usercontext = NULL;

	/* Playback */
	(*ppWave)->state = FACT_STATE_PREPARED;
	(*ppWave)->volume = 1.0f;
	(*ppWave)->pitch = 0;
	(*ppWave)->loopCount = nLoopCount;

	/* TODO: Convert dwPlayOffset to a byte offset */
	FAudio_assert(dwPlayOffset == 0);
#if 0
	if (dwFlags & FACT_FLAG_UNITS_MS)
	{
		dwPlayOffset = (uint32_t) (
			( /* Samples per millisecond... */
				(float) entry->Format.nSamplesPerSec /
				1000.0f
			) * (float) dwPlayOffset
		);
	}
#endif

	/* Create the voice */
	send.Flags = 0;
	send.pOutputVoice = pWaveBank->parentEngine->master;
	sends.SendCount = 1;
	sends.pSends = &send;
	format.pcm.nChannels = entry->Format.nChannels;
	format.pcm.nSamplesPerSec = entry->Format.nSamplesPerSec;
	if (entry->Format.wFormatTag == 0x0)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_PCM;
		format.pcm.wBitsPerSample = 8 << entry->Format.wBitsPerSample;
		format.pcm.nBlockAlign = format.pcm.nChannels * format.pcm.wBitsPerSample / 8;
		format.pcm.nAvgBytesPerSec = format.pcm.nBlockAlign * format.pcm.nSamplesPerSec;
		format.pcm.cbSize = 0;
	}
	else if (entry->Format.wFormatTag == 0x1)
	{
		/* XMA2 is quite similar to WMA Pro... is what everyone thought.
		 * What a great way to start this comment.
		 *
		 * Let's reconstruct the extra data because who knows what decoder we're dealing with in <present year>.
		 * It's also a good exercise in understanding XMA2 metadata and feeding blocks into the decoder properly.
		 * At the time of writing this patch, it's FFmpeg via gstreamer which doesn't even respect most of this.
		 * ... which means: good luck to whoever ends up finding inaccuracies here in the future!
		 *
		 * dwLoopLength seems to match dwPlayLength in everything I've seen that had bLoopCount == 0.
		 * dwLoopBegin can be > 0 even with bLoopCount == 0 because why not. Let's ignore that.
		 *
		 * dwSamplesEncoded is usually close to dwPlayLength but not always (if ever?) equal. Let's assume equality.
		 * The XMA2 seek table uses sample indices as opposed to WMA's byte index seek table.
		 *
		 * nBlockAlign uses aWMABlockAlign given the entire WMA Pro thing BUT it's expected to be the block size for decoding.
		 * The XMA2 block size MUST be a multiple of 2048 BUT entry->PlayRegion.dwLength / seek->entryCount doesn't respect that.
		 * And even when correctly guesstimating the block size, we sometimes end up with block sizes >= 64k BYTES. nBlockAlign IS 16-BIT!
		 * Scrap nBlockAlign. I've given up and made all FAudio gstreamer functions use dwBytesPerBlock if available.
		 * Still though, if we don't want FAudio_INTERNAL_DecodeGSTREAMER to hang, the total data length must match (see SoundEffect.cs in FNA).
		 * As such, we round up when guessing the block size, feed GStreamer with zeroes^Wundersized blocks and hope for the best.
		 *
		 * This is FUN.
		 * -ade
		 */
		FAudio_assert(entry->Format.wBitsPerSample != 0);

		seek = &pWaveBank->seekTables[nWaveIndex];
		format.pcm.wFormatTag = FAUDIO_FORMAT_XMAUDIO2;
		format.pcm.wBitsPerSample = 16;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.cbSize = (
			sizeof(FAudioXMA2WaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.xma2.wNumStreams = (format.pcm.nChannels + 1) / 2;
		format.xma2.dwChannelMask = format.pcm.nChannels > 1 ? 0xFFFFFFFF >> (32 - format.pcm.nChannels) : 0;
		format.xma2.dwSamplesEncoded = seek->entries[seek->entryCount - 1];
		format.xma2.dwBytesPerBlock = (uint16_t) FAudio_ceil(
			(double) entry->PlayRegion.dwLength /
			(double) seek->entryCount /
			2048.0
		) * 2048;
		format.xma2.dwPlayBegin = format.xma2.dwLoopBegin = 0;
		format.xma2.dwPlayLength = format.xma2.dwLoopLength = format.xma2.dwSamplesEncoded;
		format.xma2.bLoopCount = 0;
		format.xma2.bEncoderVersion = 4;
		format.xma2.wBlockCount = seek->entryCount;
	}
	else if (entry->Format.wFormatTag == 0x2)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_MSADPCM;
		format.pcm.nBlockAlign = (entry->Format.wBlockAlign + 22) * format.pcm.nChannels;
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = (
			sizeof(FAudioADPCMWaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.adpcm.wSamplesPerBlock = (
			((format.pcm.nBlockAlign / format.pcm.nChannels) - 6) * 2
		);
	}
	else if (entry->Format.wFormatTag == 0x3)
	{
		/* Apparently this is used to detect WMA Pro...? */
		FAudio_assert(entry->Format.wBitsPerSample == 0);

		format.pcm.wFormatTag = FAUDIO_FORMAT_WMAUDIO2;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = 0;
	}
	else
	{
		FAudio_assert(0 && "Rebuild your WaveBanks with ADPCM!");
	}
	(*ppWave)->callback.callback.OnBufferEnd = pWaveBank->streaming ?
		FACT_INTERNAL_OnBufferEnd :
		NULL;
	(*ppWave)->callback.callback.OnBufferStart = NULL;
	(*ppWave)->callback.callback.OnLoopEnd = NULL;
	(*ppWave)->callback.callback.OnStreamEnd = FACT_INTERNAL_OnStreamEnd;
	(*ppWave)->callback.callback.OnVoiceError = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassEnd = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassStart = NULL;
	(*ppWave)->callback.wave = *ppWave;
	(*ppWave)->srcChannels = format.pcm.nChannels;
	FAudio_CreateSourceVoice(
		pWaveBank->parentEngine->audio,
		&(*ppWave)->voice,
		&format.pcm,
		FAUDIO_VOICE_USEFILTER, /* FIXME: Can this be optional? */
		4.0f,
		(FAudioVoiceCallback*) &(*ppWave)->callback,
		&sends,
		NULL
	);
	if (pWaveBank->streaming)
	{
		/* Init stream cache info */
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_PCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec *
				format.pcm.nBlockAlign
			);
		}
		else if (format.pcm.wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec /
				format.adpcm.wSamplesPerBlock *
				format.pcm.nBlockAlign
			);
		}
		else
		{
			/* Screw it, load the whole thing */
			(*ppWave)->streamSize = entry->PlayRegion.dwLength;

			/* XACT does NOT support loop subregions for these formats */
			FAudio_assert(entry->LoopRegion.dwStartSample == 0);
			FAudio_assert(entry->LoopRegion.dwTotalSamples == 0 || entry->LoopRegion.dwTotalSamples == entry->Duration);
		}
		(*ppWave)->streamCache = (uint8_t*) pWaveBank->parentEngine->pMalloc(
			(*ppWave)->streamSize
		);
		(*ppWave)->streamOffset = entry->PlayRegion.dwOffset;

		/* Read and submit first buffer from the WaveBank */
		FACT_INTERNAL_OnBufferEnd(&(*ppWave)->callback.callback, NULL);
	}
	else
	{
		(*ppWave)->streamCache = NULL;

		buffer.Flags = FAUDIO_END_OF_STREAM;
		buffer.AudioBytes = entry->PlayRegion.dwLength;
		buffer.pAudioData = FAudio_memptr(
			pWaveBank->io,
			entry->PlayRegion.dwOffset
		);
		buffer.PlayBegin = 0;
		buffer.PlayLength = entry->Duration;
		if (nLoopCount == 0)
		{
			buffer.LoopBegin = 0;
			buffer.LoopLength = 0;
			buffer.LoopCount = 0;
		}
		else
		{
			buffer.LoopBegin = entry->LoopRegion.dwStartSample;
			buffer.LoopLength = entry->LoopRegion.dwTotalSamples;
			buffer.LoopCount = nLoopCount;
		}
		buffer.pContext = NULL;
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			bufferWMA.pDecodedPacketCumulativeBytes =
				pWaveBank->seekTables[nWaveIndex].entries;
			bufferWMA.PacketCount =
				pWaveBank->seekTables[nWaveIndex].entryCount;
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				&bufferWMA
			);
		}
		else
		{
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				NULL
			);
		}
	}

	/* Add to the WaveBank Wave list */
	LinkedList_AddEntry(
		&pWaveBank->waveList,
		*ppWave,
		pWaveBank->waveLock,
		pWaveBank->parentEngine->pMalloc
	);

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}